

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaTargetGenerator::ExportObjectCompileCommand
          (cmNinjaTargetGenerator *this,string *language,string *sourceFileName,string *objectDir,
          string *objectFileName,string *objectFileDir,string *flags,string *defines,
          string *includes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  cmGeneratorTarget *pcVar3;
  pointer pbVar4;
  bool bVar5;
  int iVar6;
  cmGlobalNinjaGenerator *pcVar7;
  string *psVar8;
  long *plVar9;
  string *psVar10;
  undefined4 extraout_var;
  ulong *puVar11;
  char *pcVar12;
  cmOutputConverter *outputConverter;
  string *i;
  pointer s;
  string escapedSourceFileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  RuleVariables compileObjectVars;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  cmRulePlaceholderExpander *local_1b0;
  string local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  string *local_170;
  string *local_168;
  string *local_160;
  undefined1 local_158 [48];
  pointer local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  pointer local_e8;
  pointer local_e0;
  pointer local_d8;
  pointer local_d0;
  pointer local_90;
  pointer local_88;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_168 = objectFileName;
  local_160 = objectDir;
  local_158._0_8_ = local_158 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_158,"CMAKE_EXPORT_COMPILE_COMMANDS","");
  bVar5 = cmMakefile::IsOn(this_00,(string *)local_158);
  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  if (bVar5) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)local_158);
    local_128 = (language->_M_dataplus)._M_p;
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    pcVar2 = (sourceFileName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,pcVar2,pcVar2 + sourceFileName->_M_string_length);
    bVar5 = cmsys::SystemTools::FileIsFullPath(sourceFileName);
    if (!bVar5) {
      pcVar7 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      psVar8 = cmake::GetHomeOutputDirectory_abi_cxx11_
                         ((pcVar7->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      cmsys::SystemTools::CollapseFullPath(&local_1f0,&local_1a8,psVar8);
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
    }
    local_170 = sourceFileName;
    cmOutputConverter::ConvertToOutputFormat
              (&local_1f0,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_1a8,SHELL);
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p;
    local_e8 = (local_168->_M_dataplus)._M_p;
    local_e0 = (local_160->_M_dataplus)._M_p;
    local_d8 = (objectFileDir->_M_dataplus)._M_p;
    local_d0 = (flags->_M_dataplus)._M_p;
    local_90 = (defines->_M_dataplus)._M_p;
    local_88 = (includes->_M_dataplus)._M_p;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar6 = std::__cxx11::string::compare((char *)language);
    if (iVar6 == 0) {
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      local_1f0._M_string_length = 0;
      local_1f0.field_2._M_allocated_capacity =
           local_1f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      paVar1 = &local_1d0.field_2;
      local_1d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d0,"CUDA_SEPARABLE_COMPILATION","");
      psVar8 = local_170;
      bVar5 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d0._M_dataplus._M_p,
                        CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                                 local_1d0.field_2._M_local_buf[0]) + 1);
      }
      if (bVar5) {
        pcVar12 = "CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION";
      }
      else {
        pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
        local_1d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d0,"CUDA_PTX_COMPILATION","");
        bVar5 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d0._M_dataplus._M_p,
                          CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                                   local_1d0.field_2._M_local_buf[0]) + 1);
        }
        pcVar12 = "CMAKE_CUDA_COMPILE_WHOLE_COMPILATION";
        if (bVar5) {
          pcVar12 = "CMAKE_CUDA_COMPILE_PTX_COMPILATION";
        }
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_1f0,0,(char *)local_1f0._M_string_length,(ulong)pcVar12);
      psVar10 = cmMakefile::GetRequiredDefinition
                          ((this->super_cmCommonTargetGenerator).Makefile,&local_1f0);
      cmSystemTools::ExpandListArgument(psVar10,&local_188,false);
    }
    else {
      std::operator+(&local_1d0,"CMAKE_",language);
      psVar8 = local_170;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_1d0);
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      puVar11 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_1f0.field_2._M_allocated_capacity = *puVar11;
        local_1f0.field_2._8_8_ = plVar9[3];
      }
      else {
        local_1f0.field_2._M_allocated_capacity = *puVar11;
        local_1f0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_1f0._M_string_length = plVar9[1];
      *plVar9 = (long)puVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,
                        CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                                 local_1d0.field_2._M_local_buf[0]) + 1);
      }
      psVar10 = cmMakefile::GetRequiredDefinition
                          ((this->super_cmCommonTargetGenerator).Makefile,&local_1f0);
      cmSystemTools::ExpandListArgument(psVar10,&local_188,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    iVar6 = (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              _vptr_cmLocalGenerator[5])();
    pbVar4 = local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1b0 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar6);
    if (local_188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      s = local_188.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
      do {
        outputConverter =
             &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter;
        if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
          outputConverter = (cmOutputConverter *)0x0;
        }
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (local_1b0,outputConverter,s,(RuleVariables *)local_158);
        s = s + 1;
      } while (s != pbVar4);
    }
    local_1d0._M_string_length = 0;
    local_1d0.field_2._M_local_buf[0] = '\0';
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_1f0,this->LocalGenerator,&local_188,&local_1d0,(cmGeneratorTarget *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,
                      CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                               local_1d0.field_2._M_local_buf[0]) + 1);
    }
    pcVar7 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::AddCXXCompileCommand(pcVar7,&local_1f0,psVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if (local_1b0 != (cmRulePlaceholderExpander *)0x0) {
      std::default_delete<cmRulePlaceholderExpander>::operator()
                ((default_delete<cmRulePlaceholderExpander> *)&local_1b0,local_1b0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::ExportObjectCompileCommand(
  std::string const& language, std::string const& sourceFileName,
  std::string const& objectDir, std::string const& objectFileName,
  std::string const& objectFileDir, std::string const& flags,
  std::string const& defines, std::string const& includes)
{
  if (!this->Makefile->IsOn("CMAKE_EXPORT_COMPILE_COMMANDS")) {
    return;
  }

  cmRulePlaceholderExpander::RuleVariables compileObjectVars;
  compileObjectVars.Language = language.c_str();

  std::string escapedSourceFileName = sourceFileName;

  if (!cmSystemTools::FileIsFullPath(sourceFileName)) {
    escapedSourceFileName =
      cmSystemTools::CollapseFullPath(escapedSourceFileName,
                                      this->GetGlobalGenerator()
                                        ->GetCMakeInstance()
                                        ->GetHomeOutputDirectory());
  }

  escapedSourceFileName = this->LocalGenerator->ConvertToOutputFormat(
    escapedSourceFileName, cmOutputConverter::SHELL);

  compileObjectVars.Source = escapedSourceFileName.c_str();
  compileObjectVars.Object = objectFileName.c_str();
  compileObjectVars.ObjectDir = objectDir.c_str();
  compileObjectVars.ObjectFileDir = objectFileDir.c_str();
  compileObjectVars.Flags = flags.c_str();
  compileObjectVars.Defines = defines.c_str();
  compileObjectVars.Includes = includes.c_str();

  // Rule for compiling object file.
  std::vector<std::string> compileCmds;
  if (language == "CUDA") {
    std::string cmdVar;
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION";
    } else if (this->GeneratorTarget->GetPropertyAsBool(
                 "CUDA_PTX_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_PTX_COMPILATION";
    } else {
      cmdVar = "CMAKE_CUDA_COMPILE_WHOLE_COMPILATION";
    }
    const std::string& compileCmd =
      this->GetMakefile()->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  } else {
    const std::string cmdVar = "CMAKE_" + language + "_COMPILE_OBJECT";
    const std::string& compileCmd =
      this->GetMakefile()->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  for (std::string& i : compileCmds) {
    // no launcher for CMAKE_EXPORT_COMPILE_COMMANDS
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 compileObjectVars);
  }

  std::string cmdLine =
    this->GetLocalGenerator()->BuildCommandLine(compileCmds);

  this->GetGlobalGenerator()->AddCXXCompileCommand(cmdLine, sourceFileName);
}